

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoCube> *this,TPZGeoCube *geo,int matind,TPZGeoMesh *mesh)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  long lVar8;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016ba530;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016ba188,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016b9e88;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016b2fe8;
  iVar1 = (geo->super_TPZNodeRep<8,_pztopology::TPZCube>).fNodeIndexes[1];
  iVar2 = (geo->super_TPZNodeRep<8,_pztopology::TPZCube>).fNodeIndexes[2];
  iVar3 = (geo->super_TPZNodeRep<8,_pztopology::TPZCube>).fNodeIndexes[3];
  iVar4 = (geo->super_TPZNodeRep<8,_pztopology::TPZCube>).fNodeIndexes[4];
  iVar5 = (geo->super_TPZNodeRep<8,_pztopology::TPZCube>).fNodeIndexes[5];
  iVar6 = (geo->super_TPZNodeRep<8,_pztopology::TPZCube>).fNodeIndexes[6];
  iVar7 = (geo->super_TPZNodeRep<8,_pztopology::TPZCube>).fNodeIndexes[7];
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0] =
       (geo->super_TPZNodeRep<8,_pztopology::TPZCube>).fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2] = iVar2;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3] = iVar3;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4] = iVar4;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5] = iVar5;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6] = iVar6;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7] = iVar7;
  (this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoCube_016b2f60;
  lVar8 = 0x98;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar8 + -0x58) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar8 + -0x48) =
         0xffffffff;
    *(undefined8 *)((long)(&this->fGeo + -1) + lVar8) = 0xffffffffffffffff;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 800);
  for (lVar8 = 0x98; lVar8 != 800; lVar8 = lVar8 + 0x18) {
    *(undefined8 *)((long)(&this->fGeo + -1) + lVar8) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes + lVar8 + -0x48) =
         0xffffffff;
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}